

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O1

void ParseChassisInformation(EeePChassisInfo_t *info)

{
  uint8_t *puVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  uint8_t uVar5;
  uint8_t *__s;
  uint8_t *puVar6;
  
  __s = &info->CElement[0].ElementType + (ulong)info->CElementSize * (ulong)info->CElementCnt;
  uVar5 = info->Manufacturer;
  puVar6 = __s;
  if (uVar5 == '\0') {
    puVar6 = (uint8_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar2 = strlen((char *)puVar6);
      puVar6 = puVar6 + sVar2 + 1;
    }
  }
  if (puVar6 != (uint8_t *)0x0) {
    printf("      Manufacturer: %s\n",puVar6);
  }
  lVar3 = 8;
  pcVar4 = "";
  do {
    if (*(byte *)((long)&BoardTypeTexts[0xc].text + lVar3) == info->Type) {
      pcVar4 = *(char **)(&ChassisTypeTexts[0].code + lVar3);
      break;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x198);
  puVar6 = (uint8_t *)0x0;
  printf("      Chassis Type: %d (%s)\n",(ulong)info->Type,pcVar4);
  uVar5 = info->Version;
  puVar1 = __s;
  if (uVar5 != '\0') {
    while (puVar6 = puVar1, uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar2 = strlen((char *)puVar6);
      puVar1 = puVar6 + sVar2 + 1;
    }
  }
  if (puVar6 != (uint8_t *)0x0) {
    printf("      Version: %s\n",puVar6);
  }
  uVar5 = info->SerialNumber;
  puVar6 = __s;
  if (uVar5 == '\0') {
    puVar6 = (uint8_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar2 = strlen((char *)puVar6);
      puVar6 = puVar6 + sVar2 + 1;
    }
  }
  if (puVar6 != (uint8_t *)0x0) {
    printf("      Serial Number: %s\n",puVar6);
  }
  uVar5 = info->AssetTagNumber;
  if (uVar5 == '\0') {
    __s = (uint8_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar2 = strlen((char *)__s);
      __s = __s + sVar2 + 1;
    }
  }
  if (__s != (uint8_t *)0x0) {
    printf("      Asset Tag: %s\n",__s);
  }
  printf("      Height: %dU\n",(ulong)info->Height);
  printf("      Number of Power Cords: %d\n",(ulong)info->NumPowerCords);
  return;
}

Assistant:

void ParseChassisInformation(EeePChassisInfo_t *info)
{
    void *strstart = (unsigned char *)info->CElement + info->CElementCnt * info->CElementSize;
    const char *str;
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        printf("      Manufacturer: %s\n", str);
    }
    printf("      Chassis Type: %d (%s)\n",
        info->Type, FindChassisTypeText(info->Type));
    if (str = GetSmbiosString(info->Version, strstart)) {
        printf("      Version: %s\n", str);
    }
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        printf("      Serial Number: %s\n", str);
    }
    if (str = GetSmbiosString(info->AssetTagNumber, strstart)) {
        printf("      Asset Tag: %s\n", str);
    }
    printf("      Height: %dU\n", info->Height);
    printf("      Number of Power Cords: %d\n", info->NumPowerCords);
}